

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void fetchTransformed_fetcher<(TextureBlendType)2,(QPixelLayout::BPP)6,unsigned_int>
               (uint *buffer,QSpanData *data,int y,int x,int length)

{
  undefined8 uVar1;
  int iVar2;
  uchar *puVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint *puVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  double dVar15;
  double dVar16;
  uint uVar17;
  double dVar18;
  uint uVar19;
  double dVar20;
  uint uVar21;
  uint uVar22;
  double dVar23;
  uint uVar24;
  double dVar25;
  double dVar26;
  uint uVar28;
  int iVar29;
  double dVar30;
  undefined1 auVar27 [16];
  uint uVar31;
  uint uVar32;
  double local_a8;
  double dStack_a0;
  
  dVar18 = (double)x + 0.5;
  dVar25 = (double)y + 0.5;
  if ((data->field_0x8a & 1) == 0) {
    local_a8 = data->m11;
    dStack_a0 = data->m12;
LAB_0065a280:
    if (0 < length) {
      dVar15 = data->m13;
      puVar11 = buffer + length;
      dVar26 = data->m23 * dVar25 + dVar18 * dVar15 + data->m33;
      dVar30 = data->dx + data->m21 * dVar25 + dVar18 * local_a8;
      dVar18 = data->dy + data->m22 * dVar25 + dVar18 * dStack_a0;
      puVar3 = (data->field_23).texture.imageData;
      lVar6 = (data->field_23).texture.bytesPerLine;
      do {
        dVar16 = (double)(-(ulong)(dVar26 == 0.0) & 0x3ff0000000000000 |
                         ~-(ulong)(dVar26 == 0.0) & (ulong)(1.0 / dVar26));
        dVar25 = floor(dVar30 * dVar16);
        dVar16 = floor(dVar18 * dVar16);
        iVar4 = (data->field_23).texture.y2 + -1;
        if ((int)dVar16 <= iVar4) {
          iVar4 = (int)dVar16;
        }
        iVar13 = (data->field_23).texture.x1;
        iVar10 = (data->field_23).texture.y1;
        if (iVar4 <= iVar10) {
          iVar4 = iVar10;
        }
        iVar10 = (data->field_23).texture.x2 + -1;
        if ((int)dVar25 <= iVar10) {
          iVar10 = (int)dVar25;
        }
        if (iVar10 <= iVar13) {
          iVar10 = iVar13;
        }
        *buffer = *(uint *)(puVar3 + (long)iVar10 * 4 + iVar4 * lVar6);
        dVar30 = dVar30 + local_a8;
        dVar18 = dVar18 + dStack_a0;
        dVar26 = dVar26 + dVar15;
        dVar26 = (double)((ulong)dVar26 & -(ulong)(dVar26 != 0.0) |
                         ~-(ulong)(dVar26 != 0.0) & (ulong)(dVar15 + dVar26));
        buffer = buffer + 1;
      } while (buffer < puVar11);
    }
    return;
  }
  local_a8 = data->m11;
  dStack_a0 = data->m12;
  dVar26 = (dVar25 * data->m21 + dVar18 * local_a8 + data->dx) * 65536.0;
  dVar30 = (dVar25 * data->m22 + dVar18 * dStack_a0 + data->dy) * 65536.0;
  dVar15 = dVar30;
  if (dVar26 <= dVar30) {
    dVar15 = dVar26;
  }
  dVar16 = trunc(local_a8 * 65536.0);
  dVar23 = trunc(dStack_a0 * 65536.0);
  dVar20 = (double)length * dVar16 + dVar26;
  dVar23 = (double)length * dVar23 + dVar30;
  dVar16 = dVar23;
  if (dVar20 <= dVar23) {
    dVar16 = dVar20;
  }
  if (dVar15 <= dVar16) {
    dVar16 = dVar15;
  }
  if (dVar16 < -2147483648.0) goto LAB_0065a280;
  dVar15 = dVar30;
  if (dVar30 <= dVar26) {
    dVar15 = dVar26;
  }
  if (dVar23 <= dVar20) {
    dVar23 = dVar20;
  }
  if (dVar23 <= dVar15) {
    dVar23 = dVar15;
  }
  if (2147483647.0 < dVar23) goto LAB_0065a280;
  uVar14 = (uint)(local_a8 * 65536.0);
  uVar17 = (uint)(dStack_a0 * 65536.0);
  iVar4 = (int)dVar26;
  iVar13 = (int)dVar30;
  if (uVar17 == 0) {
    iVar10 = (data->field_23).texture.y2 + -1;
    if (iVar13 >> 0x10 <= iVar10) {
      iVar10 = iVar13 >> 0x10;
    }
    iVar13 = (data->field_23).texture.y1;
    if (iVar10 <= iVar13) {
      iVar10 = iVar13;
    }
    lVar6 = (long)iVar10 * (data->field_23).texture.bytesPerLine;
    puVar3 = (data->field_23).texture.imageData;
    if ((int)uVar14 < 1) {
      uVar17 = length;
      if (-1 < (int)uVar14) goto LAB_0065a6b0;
      lVar7 = (long)(data->field_23).texture.x1 * 0x10000 - (long)iVar4;
      uVar12 = (ulong)(int)uVar14;
    }
    else {
      lVar7 = ((long)(data->field_23).texture.x2 * 0x10000 - (long)iVar4) + -0x10000;
      uVar12 = (ulong)uVar14;
    }
    uVar17 = (uint)(lVar7 / (long)uVar12);
    if (length <= (int)uVar17) {
      uVar17 = length;
    }
LAB_0065a6b0:
    uVar12 = (ulong)uVar17;
    if ((int)uVar17 < 1) {
      uVar8 = 0;
LAB_0065a702:
      uVar12 = uVar8;
      if ((int)uVar12 < (int)uVar17) {
        uVar12 = uVar12 & 0xffffffff;
        do {
          buffer[uVar12] = *(uint *)(puVar3 + (long)(iVar4 >> 0x10) * 4 + lVar6);
          iVar4 = iVar4 + uVar14;
          uVar12 = uVar12 + 1;
        } while ((int)uVar12 < (int)uVar17);
      }
    }
    else {
      uVar8 = 0;
      do {
        iVar29 = iVar4 >> 0x10;
        iVar13 = (data->field_23).texture.x1;
        iVar10 = (data->field_23).texture.x2 + -1;
        if (iVar29 <= iVar10) {
          iVar10 = iVar29;
        }
        if (iVar10 <= iVar13) {
          iVar10 = iVar13;
        }
        if (iVar10 == iVar29) goto LAB_0065a702;
        buffer[uVar8] = *(uint *)(puVar3 + (long)iVar10 * 4 + lVar6);
        iVar4 = iVar4 + uVar14;
        uVar8 = uVar8 + 1;
      } while (uVar12 != uVar8);
    }
    if (length <= (int)uVar12) {
      return;
    }
    puVar11 = buffer + (uVar12 & 0xffffffff);
    do {
      iVar13 = (data->field_23).texture.x2 + -1;
      if (iVar4 >> 0x10 <= iVar13) {
        iVar13 = iVar4 >> 0x10;
      }
      iVar10 = (data->field_23).texture.x1;
      if (iVar13 <= iVar10) {
        iVar13 = iVar10;
      }
      *puVar11 = *(uint *)(puVar3 + (long)iVar13 * 4 + lVar6);
      iVar4 = iVar4 + uVar14;
      puVar11 = puVar11 + 1;
      uVar17 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar17;
    } while ((int)uVar17 < length);
    return;
  }
  if ((int)uVar14 < 1) {
    uVar5 = length;
    if (-1 < (int)uVar14) goto LAB_0065a4c1;
    lVar6 = (long)(data->field_23).texture.x1 * 0x10000 - (long)iVar4;
    uVar12 = (ulong)(int)uVar14;
  }
  else {
    lVar6 = ((long)(data->field_23).texture.x2 * 0x10000 - (long)iVar4) + -0x10000;
    uVar12 = (ulong)uVar14;
  }
  uVar5 = (uint)(lVar6 / (long)uVar12);
  if (length <= (int)uVar5) {
    uVar5 = length;
  }
LAB_0065a4c1:
  if ((int)uVar17 < 1) {
    lVar6 = (long)(data->field_23).texture.y1 * 0x10000 - (long)iVar13;
    uVar12 = (ulong)(int)uVar17;
  }
  else {
    lVar6 = ((long)(data->field_23).texture.y2 * 0x10000 - (long)iVar13) + -0x10000;
    uVar12 = (ulong)uVar17;
  }
  uVar8 = lVar6 / (long)uVar12 & 0xffffffff;
  if ((int)uVar5 < (int)(lVar6 / (long)uVar12)) {
    uVar8 = (ulong)uVar5;
  }
  iVar10 = (int)uVar8;
  if (iVar10 < 1) {
    uVar9 = 0;
LAB_0065a5ba:
    if ((int)uVar9 < iVar10) {
      puVar3 = (data->field_23).texture.imageData;
      lVar6 = (data->field_23).texture.bytesPerLine;
      uVar9 = uVar9 & 0xffffffff;
      do {
        buffer[uVar9] = *(uint *)(puVar3 + (long)(iVar4 >> 0x10) * 4 + (iVar13 >> 0x10) * lVar6);
        iVar4 = iVar4 + uVar14;
        iVar13 = iVar13 + uVar17;
        uVar9 = uVar9 + 1;
      } while ((int)uVar9 < iVar10);
    }
    uVar8 = uVar9 & 0xffffffff;
  }
  else {
    uVar9 = 0;
    do {
      uVar24 = iVar4 >> 0x10;
      uVar28 = iVar13 >> 0x10;
      uVar5 = (data->field_23).texture.x1;
      uVar22 = (data->field_23).texture.y1;
      uVar1 = *(undefined8 *)((long)&data->field_23 + 0x18);
      uVar19 = (int)uVar1 - 1;
      uVar21 = (int)((ulong)uVar1 >> 0x20) - 1;
      uVar31 = -(uint)((int)uVar19 < (int)uVar24);
      uVar32 = -(uint)((int)uVar21 < (int)uVar28);
      uVar31 = ~uVar31 & uVar24 | uVar19 & uVar31;
      uVar32 = ~uVar32 & uVar28 | uVar21 & uVar32;
      uVar19 = -(uint)((int)uVar5 < (int)uVar31);
      uVar21 = -(uint)((int)uVar22 < (int)uVar32);
      uVar5 = ~uVar19 & uVar5 | uVar31 & uVar19;
      uVar22 = ~uVar21 & uVar22 | uVar32 & uVar21;
      auVar27._0_4_ = -(uint)(uVar24 == uVar5);
      iVar29 = -(uint)(uVar28 == uVar22);
      auVar27._4_4_ = auVar27._0_4_;
      auVar27._8_4_ = iVar29;
      auVar27._12_4_ = iVar29;
      iVar29 = movmskpd((int)uVar12,auVar27);
      if (iVar29 == 3) goto LAB_0065a5ba;
      uVar5 = *(uint *)((data->field_23).texture.imageData +
                       (long)(int)uVar5 * 4 +
                       (long)(int)uVar22 * (data->field_23).texture.bytesPerLine);
      uVar12 = (ulong)uVar5;
      buffer[uVar9] = uVar5;
      iVar4 = iVar4 + uVar14;
      iVar13 = iVar13 + uVar17;
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (length <= (int)uVar8) {
    return;
  }
  puVar3 = (data->field_23).texture.imageData;
  lVar6 = (data->field_23).texture.bytesPerLine;
  puVar11 = buffer + uVar8;
  do {
    iVar10 = (data->field_23).texture.x2 + -1;
    if (iVar4 >> 0x10 <= iVar10) {
      iVar10 = iVar4 >> 0x10;
    }
    iVar29 = (data->field_23).texture.x1;
    if (iVar10 <= iVar29) {
      iVar10 = iVar29;
    }
    iVar29 = (data->field_23).texture.y2 + -1;
    if (iVar13 >> 0x10 <= iVar29) {
      iVar29 = iVar13 >> 0x10;
    }
    iVar2 = (data->field_23).texture.y1;
    if (iVar29 <= iVar2) {
      iVar29 = iVar2;
    }
    *puVar11 = *(uint *)(puVar3 + (long)iVar10 * 4 + iVar29 * lVar6);
    iVar4 = iVar4 + uVar14;
    iVar13 = iVar13 + uVar17;
    puVar11 = puVar11 + 1;
    uVar5 = (int)uVar8 + 1;
    uVar8 = (ulong)uVar5;
  } while ((int)uVar5 < length);
  return;
}

Assistant:

static void QT_FASTCALL fetchTransformed_fetcher(T *buffer, const QSpanData *data,
                                                 int y, int x, int length)
{
    static_assert(blendType == BlendTransformed || blendType == BlendTransformedTiled);
    const QTextureData &image = data->texture;

    const qreal cx = x + qreal(0.5);
    const qreal cy = y + qreal(0.5);

    constexpr bool useFetch = (bpp < QPixelLayout::BPP32) && sizeof(T) == sizeof(uint);
    const QPixelLayout *layout = &qPixelLayouts[data->texture.format];
    if (!useFetch)
        Q_ASSERT(layout->bpp == bpp || (layout->bpp == QPixelLayout::BPP16FPx4 && bpp == QPixelLayout::BPP64));
    // When templated 'fetch' should be inlined at compile time:
    const Fetch1PixelFunc fetch1 = (bpp == QPixelLayout::BPPNone) ? fetch1PixelTable[layout->bpp] : Fetch1PixelFunc(fetch1Pixel<bpp>);

    if (canUseFastMatrixPath(cx, cy, length, data)) {
        // The increment pr x in the scanline
        int fdx = (int)(data->m11 * fixed_scale);
        int fdy = (int)(data->m12 * fixed_scale);

        int fx = int((data->m21 * cy
                      + data->m11 * cx + data->dx) * fixed_scale);
        int fy = int((data->m22 * cy
                      + data->m12 * cx + data->dy) * fixed_scale);

        if (fdy == 0) { // simple scale, no rotation or shear
            int py = (fy >> 16);
            fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, py);
            const uchar *src = image.scanLine(py);

            int i = 0;
            if (blendType == BlendTransformed) {
                int fastLen = length;
                if (fdx > 0)
                    fastLen = qMin(fastLen, int((qint64(image.x2 - 1) * fixed_scale - fx) / fdx));
                else if (fdx < 0)
                    fastLen = qMin(fastLen, int((qint64(image.x1) * fixed_scale - fx) / fdx));

                for (; i < fastLen; ++i) {
                    int x1 = (fx >> 16);
                    int x2 = x1;
                    fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1);
                    if (x1 == x2)
                        break;
                    if constexpr (useFetch)
                        buffer[i] = fetch1(src, x1);
                    else
                        buffer[i] = reinterpret_cast<const T*>(src)[x1];
                    fx += fdx;
                }

                for (; i < fastLen; ++i) {
                    int px = (fx >> 16);
                    if constexpr (useFetch)
                        buffer[i] = fetch1(src, px);
                    else
                        buffer[i] = reinterpret_cast<const T*>(src)[px];
                    fx += fdx;
                }
            }

            for (; i < length; ++i) {
                int px = (fx >> 16);
                fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, px);
                if constexpr (useFetch)
                    buffer[i] = fetch1(src, px);
                else
                    buffer[i] = reinterpret_cast<const T*>(src)[px];
                fx += fdx;
            }
        } else { // rotation or shear
            int i = 0;
            if (blendType == BlendTransformed) {
                int fastLen = length;
                if (fdx > 0)
                    fastLen = qMin(fastLen, int((qint64(image.x2 - 1) * fixed_scale - fx) / fdx));
                else if (fdx < 0)
                    fastLen = qMin(fastLen, int((qint64(image.x1) * fixed_scale - fx) / fdx));
                if (fdy > 0)
                    fastLen = qMin(fastLen, int((qint64(image.y2 - 1) * fixed_scale - fy) / fdy));
                else if (fdy < 0)
                    fastLen = qMin(fastLen, int((qint64(image.y1) * fixed_scale - fy) / fdy));

                for (; i < fastLen; ++i) {
                    int x1 = (fx >> 16);
                    int y1 = (fy >> 16);
                    int x2 = x1;
                    int y2 = y1;
                    fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1);
                    fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1);
                    if (x1 == x2 && y1 == y2)
                        break;
                    if constexpr (useFetch)
                        buffer[i] = fetch1(image.scanLine(y1), x1);
                    else
                        buffer[i] = reinterpret_cast<const T*>(image.scanLine(y1))[x1];
                    fx += fdx;
                    fy += fdy;
                }

                for (; i < fastLen; ++i) {
                    int px = (fx >> 16);
                    int py = (fy >> 16);
                    if constexpr (useFetch)
                        buffer[i] = fetch1(image.scanLine(py), px);
                    else
                        buffer[i] = reinterpret_cast<const T*>(image.scanLine(py))[px];
                    fx += fdx;
                    fy += fdy;
                }
            }

            for (; i < length; ++i) {
                int px = (fx >> 16);
                int py = (fy >> 16);
                fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, px);
                fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, py);
                if constexpr (useFetch)
                    buffer[i] = fetch1(image.scanLine(py), px);
                else
                    buffer[i] = reinterpret_cast<const T*>(image.scanLine(py))[px];
                fx += fdx;
                fy += fdy;
            }
        }
    } else {
        const qreal fdx = data->m11;
        const qreal fdy = data->m12;
        const qreal fdw = data->m13;

        qreal fx = data->m21 * cy + data->m11 * cx + data->dx;
        qreal fy = data->m22 * cy + data->m12 * cx + data->dy;
        qreal fw = data->m23 * cy + data->m13 * cx + data->m33;

        T *const end = buffer + length;
        T *b = buffer;
        while (b < end) {
            const qreal iw = fw == 0 ? 1 : 1 / fw;
            const qreal tx = fx * iw;
            const qreal ty = fy * iw;
            int px = qFloor(tx);
            int py = qFloor(ty);

            fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, py);
            fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, px);
            if constexpr (useFetch)
                *b = fetch1(image.scanLine(py), px);
            else
                *b = reinterpret_cast<const T*>(image.scanLine(py))[px];

            fx += fdx;
            fy += fdy;
            fw += fdw;
            //force increment to avoid /0
            if (!fw) {
                fw += fdw;
            }
            ++b;
        }
    }
}